

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  bool bVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  size_t itime;
  int iVar13;
  ulong uVar14;
  size_t *psVar15;
  size_t sVar16;
  int iVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 extraout_var [56];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar38;
  undefined1 auVar39 [16];
  float fVar43;
  float fVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  ulong local_150;
  anon_class_16_2_4e716a3c local_148;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 auVar46 [16];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar47._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar47._8_56_ = extraout_var;
  auVar26._8_8_ = 0;
  auVar26._0_4_ = time_range->lower;
  auVar26._4_4_ = time_range->upper;
  auVar23 = auVar47._0_16_;
  uVar12 = vcmpps_avx512vl(auVar23,auVar26,1);
  auVar46 = vblendps_avx(auVar26,auVar23,2);
  auVar23 = vinsertps_avx(auVar23,auVar26,0x50);
  bVar4 = (bool)((byte)uVar12 & 1);
  auVar18._0_4_ = (float)((uint)bVar4 * auVar46._0_4_ | (uint)!bVar4 * auVar23._0_4_);
  bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
  auVar18._4_4_ = (uint)bVar4 * auVar46._4_4_ | (uint)!bVar4 * auVar23._4_4_;
  bVar4 = (bool)((byte)(uVar12 >> 2) & 1);
  auVar18._8_4_ = (uint)bVar4 * auVar46._8_4_ | (uint)!bVar4 * auVar23._8_4_;
  bVar4 = (bool)((byte)(uVar12 >> 3) & 1);
  auVar18._12_4_ = (uint)bVar4 * auVar46._12_4_ | (uint)!bVar4 * auVar23._12_4_;
  auVar46 = vmovshdup_avx(auVar18);
  fVar52 = auVar46._0_4_;
  if (auVar18._0_4_ <= fVar52) {
    uVar12 = r->_begin;
    sVar16 = 0;
    auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar57 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar58 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar23._8_4_ = 0xff800000;
    auVar23._0_8_ = 0xff800000ff800000;
    auVar23._12_4_ = 0xff800000;
    auVar48 = ZEXT1664(auVar23);
    auVar59 = ZEXT1664(auVar23);
    auVar46._8_4_ = 0x7f800000;
    auVar46._0_8_ = 0x7f8000007f800000;
    auVar46._12_4_ = 0x7f800000;
    auVar47 = ZEXT1664(auVar46);
    auVar60 = ZEXT1664(auVar46);
    while( true ) {
      if (r->_end <= uVar12) break;
      BVar1 = (this->super_LineSegments).super_Geometry.time_range;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = BVar1.lower;
      auVar24._4_4_ = BVar1.upper;
      auVar46 = vmovshdup_avx(auVar24);
      fVar22 = BVar1.lower;
      fVar36 = auVar46._0_4_ - fVar22;
      uVar2 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar12);
      uVar11 = (ulong)(uVar2 + 1);
      pBVar3 = (this->super_LineSegments).vertices.items;
      if (uVar11 < (pBVar3->super_RawBufferView).num) {
        fVar20 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
        auVar23 = ZEXT416((uint)(fVar20 * ((fVar52 - fVar22) / fVar36) * 0.99999976));
        auVar23 = vroundss_avx(auVar23,auVar23,10);
        auVar26 = vminss_avx(auVar23,ZEXT416((uint)fVar20));
        auVar23 = ZEXT416((uint)(fVar20 * ((auVar18._0_4_ - fVar22) / fVar36) * 1.0000002));
        auVar23 = vroundss_avx(auVar23,auVar23,9);
        auVar23 = vmaxss_avx(auVar56._0_16_,auVar23);
        psVar15 = &pBVar3[(int)auVar23._0_4_].super_RawBufferView.stride;
        uVar14 = (long)(int)auVar23._0_4_ - 1;
LAB_01c4d3de:
        uVar14 = uVar14 + 1;
        if ((ulong)(long)(int)auVar26._0_4_ < uVar14) {
          local_148.primID = &local_150;
          fVar19 = auVar46._0_4_ - fVar22;
          fVar38 = (auVar18._0_4_ - fVar22) / fVar19;
          fVar19 = (fVar52 - fVar22) / fVar19;
          fVar36 = fVar20 * fVar38;
          fVar22 = fVar20 * fVar19;
          auVar26 = vroundss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),9);
          auVar24 = vroundss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),10);
          auVar46 = vmaxss_avx(auVar26,auVar56._0_16_);
          auVar23 = vminss_avx(auVar24,ZEXT416((uint)fVar20));
          iVar13 = (int)auVar46._0_4_;
          fVar37 = auVar23._0_4_;
          iVar10 = (int)auVar26._0_4_;
          iVar17 = -1;
          if (-1 < iVar10) {
            iVar17 = iVar10;
          }
          iVar9 = (int)fVar20 + 1;
          if ((int)auVar24._0_4_ < (int)fVar20 + 1) {
            iVar9 = (int)auVar24._0_4_;
          }
          local_150 = uVar12;
          local_148.this = &this->super_LineSegments;
          LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower0,&local_148,(long)iVar13);
          LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper1,&local_148,(long)(int)fVar37);
          fVar36 = fVar36 - auVar46._0_4_;
          if (iVar9 - iVar17 == 1) {
            auVar46 = vmaxss_avx(ZEXT416((uint)fVar36),ZEXT816(0) << 0x40);
            fVar20 = auVar46._0_4_;
            fVar36 = 1.0 - fVar20;
            auVar49._0_4_ = fVar20 * bupper1.lower.field_0._0_4_;
            auVar49._4_4_ = fVar20 * bupper1.lower.field_0._4_4_;
            auVar49._8_4_ = fVar20 * bupper1.lower.field_0._8_4_;
            auVar49._12_4_ = fVar20 * bupper1.lower.field_0._12_4_;
            auVar27._4_4_ = fVar36;
            auVar27._0_4_ = fVar36;
            auVar27._8_4_ = fVar36;
            auVar27._12_4_ = fVar36;
            auVar51 = vfmadd231ps_fma(auVar49,auVar27,(undefined1  [16])blower0.lower.field_0);
            auVar53._0_4_ = fVar20 * bupper1.upper.field_0._0_4_;
            auVar53._4_4_ = fVar20 * bupper1.upper.field_0._4_4_;
            auVar53._8_4_ = fVar20 * bupper1.upper.field_0._8_4_;
            auVar53._12_4_ = fVar20 * bupper1.upper.field_0._12_4_;
            auVar55 = vfmadd231ps_fma(auVar53,(undefined1  [16])blower0.upper.field_0,auVar27);
            auVar46 = vmaxss_avx(ZEXT416((uint)(fVar37 - fVar22)),ZEXT816(0) << 0x40);
            fVar22 = auVar46._0_4_;
            fVar36 = 1.0 - fVar22;
            auVar40._0_4_ = fVar22 * blower0.lower.field_0._0_4_;
            auVar40._4_4_ = fVar22 * blower0.lower.field_0._4_4_;
            auVar40._8_4_ = fVar22 * blower0.lower.field_0._8_4_;
            auVar40._12_4_ = fVar22 * blower0.lower.field_0._12_4_;
            auVar28._4_4_ = fVar36;
            auVar28._0_4_ = fVar36;
            auVar28._8_4_ = fVar36;
            auVar28._12_4_ = fVar36;
            auVar42 = vfmadd231ps_fma(auVar40,auVar28,(undefined1  [16])bupper1.lower.field_0);
            auVar32._0_4_ = fVar22 * blower0.upper.field_0._0_4_;
            auVar32._4_4_ = fVar22 * blower0.upper.field_0._4_4_;
            auVar32._8_4_ = fVar22 * blower0.upper.field_0._8_4_;
            auVar32._12_4_ = fVar22 * blower0.upper.field_0._12_4_;
            auVar35 = vfmadd231ps_fma(auVar32,auVar28,(undefined1  [16])bupper1.upper.field_0);
          }
          else {
            LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&blower1,&local_148,(long)(iVar13 + 1));
            LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&bupper0,&local_148,(long)((int)fVar37 + -1));
            auVar46 = vmaxss_avx(ZEXT416((uint)fVar36),ZEXT816(0) << 0x40);
            fVar21 = auVar46._0_4_;
            fVar36 = 1.0 - fVar21;
            auVar50._0_4_ = fVar21 * blower1.lower.field_0.m128[0];
            auVar50._4_4_ = fVar21 * blower1.lower.field_0.m128[1];
            auVar50._8_4_ = fVar21 * blower1.lower.field_0.m128[2];
            auVar50._12_4_ = fVar21 * blower1.lower.field_0.m128[3];
            auVar29._4_4_ = fVar36;
            auVar29._0_4_ = fVar36;
            auVar29._8_4_ = fVar36;
            auVar29._12_4_ = fVar36;
            auVar51 = vfmadd231ps_fma(auVar50,auVar29,(undefined1  [16])blower0.lower.field_0);
            auVar54._0_4_ = fVar21 * blower1.upper.field_0.m128[0];
            auVar54._4_4_ = fVar21 * blower1.upper.field_0.m128[1];
            auVar54._8_4_ = fVar21 * blower1.upper.field_0.m128[2];
            auVar54._12_4_ = fVar21 * blower1.upper.field_0.m128[3];
            auVar55 = vfmadd231ps_fma(auVar54,auVar29,(undefined1  [16])blower0.upper.field_0);
            auVar46 = vmaxss_avx(ZEXT416((uint)(fVar37 - fVar22)),ZEXT816(0) << 0x40);
            fVar22 = auVar46._0_4_;
            fVar36 = 1.0 - fVar22;
            auVar41._0_4_ = fVar22 * bupper0.lower.field_0.m128[0];
            auVar41._4_4_ = fVar22 * bupper0.lower.field_0.m128[1];
            auVar41._8_4_ = fVar22 * bupper0.lower.field_0.m128[2];
            auVar41._12_4_ = fVar22 * bupper0.lower.field_0.m128[3];
            auVar30._4_4_ = fVar36;
            auVar30._0_4_ = fVar36;
            auVar30._8_4_ = fVar36;
            auVar30._12_4_ = fVar36;
            auVar42 = vfmadd231ps_fma(auVar41,auVar30,(undefined1  [16])bupper1.lower.field_0);
            auVar34._0_4_ = fVar22 * bupper0.upper.field_0.m128[0];
            auVar34._4_4_ = fVar22 * bupper0.upper.field_0.m128[1];
            auVar34._8_4_ = fVar22 * bupper0.upper.field_0.m128[2];
            auVar34._12_4_ = fVar22 * bupper0.upper.field_0.m128[3];
            auVar35 = vfmadd231ps_fma(auVar34,auVar30,(undefined1  [16])bupper1.upper.field_0);
            if (iVar10 < 0) {
              iVar10 = -1;
            }
            itime = (size_t)iVar10;
            while (itime = itime + 1, (long)itime < (long)iVar9) {
              fVar22 = ((float)(int)itime / fVar20 - fVar38) / (fVar19 - fVar38);
              fVar36 = 1.0 - fVar22;
              auVar39._0_4_ = auVar42._0_4_ * fVar22;
              fVar43 = auVar42._4_4_;
              auVar39._4_4_ = fVar43 * fVar22;
              fVar44 = auVar42._8_4_;
              auVar39._8_4_ = fVar44 * fVar22;
              fVar45 = auVar42._12_4_;
              auVar39._12_4_ = fVar45 * fVar22;
              auVar31._4_4_ = fVar36;
              auVar31._0_4_ = fVar36;
              auVar31._8_4_ = fVar36;
              auVar31._12_4_ = fVar36;
              auVar46 = vfmadd231ps_fma(auVar39,auVar31,auVar51);
              auVar25._0_4_ = auVar35._0_4_ * fVar22;
              fVar36 = auVar35._4_4_;
              auVar25._4_4_ = fVar36 * fVar22;
              fVar37 = auVar35._8_4_;
              auVar25._8_4_ = fVar37 * fVar22;
              fVar21 = auVar35._12_4_;
              auVar25._12_4_ = fVar21 * fVar22;
              auVar23 = vfmadd231ps_fma(auVar25,auVar55,auVar31);
              LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_148,itime)
              ;
              local_1b8 = auVar55._0_4_;
              fStack_1b4 = auVar55._4_4_;
              fStack_1b0 = auVar55._8_4_;
              fStack_1ac = auVar55._12_4_;
              local_1a8 = auVar51._0_4_;
              fStack_1a4 = auVar51._4_4_;
              fStack_1a0 = auVar51._8_4_;
              fStack_19c = auVar51._12_4_;
              auVar46 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar46);
              auVar26 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar23);
              auVar23 = vminps_avx(auVar46,ZEXT816(0) << 0x40);
              auVar46 = vmaxps_avx(auVar26,ZEXT816(0) << 0x40);
              auVar51._0_4_ = local_1a8 + auVar23._0_4_;
              auVar51._4_4_ = fStack_1a4 + auVar23._4_4_;
              auVar51._8_4_ = fStack_1a0 + auVar23._8_4_;
              auVar51._12_4_ = fStack_19c + auVar23._12_4_;
              auVar42._0_4_ = auVar42._0_4_ + auVar23._0_4_;
              auVar42._4_4_ = fVar43 + auVar23._4_4_;
              auVar42._8_4_ = fVar44 + auVar23._8_4_;
              auVar42._12_4_ = fVar45 + auVar23._12_4_;
              auVar55._0_4_ = local_1b8 + auVar46._0_4_;
              auVar55._4_4_ = fStack_1b4 + auVar46._4_4_;
              auVar55._8_4_ = fStack_1b0 + auVar46._8_4_;
              auVar55._12_4_ = fStack_1ac + auVar46._12_4_;
              auVar35._0_4_ = auVar35._0_4_ + auVar46._0_4_;
              auVar35._4_4_ = fVar36 + auVar46._4_4_;
              auVar35._8_4_ = fVar37 + auVar46._8_4_;
              auVar35._12_4_ = fVar21 + auVar46._12_4_;
            }
          }
          auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar46 = vmaxps_avx(auVar55,auVar35);
          auVar23 = vminps_avx(auVar51,auVar42);
          aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar23,ZEXT416(geomID),0x30);
          aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar46,ZEXT416((uint)uVar12),0x30);
          auVar46 = vminps_avx((undefined1  [16])auVar60._0_16_,(undefined1  [16])aVar5);
          auVar60 = ZEXT1664(auVar46);
          auVar46 = vmaxps_avx((undefined1  [16])auVar59._0_16_,(undefined1  [16])aVar6);
          auVar59 = ZEXT1664(auVar46);
          auVar33._0_4_ = aVar5.x + aVar6.x;
          auVar33._4_4_ = aVar5.y + aVar6.y;
          auVar33._8_4_ = aVar5.z + aVar6.z;
          auVar33._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
          auVar46 = vminps_avx((undefined1  [16])auVar47._0_16_,auVar33);
          auVar47 = ZEXT1664(auVar46);
          auVar46 = vmaxps_avx((undefined1  [16])auVar48._0_16_,auVar33);
          auVar48 = ZEXT1664(auVar46);
          sVar16 = sVar16 + 1;
          prims[k].lower.field_0.field_1 = aVar5;
          prims[k].upper.field_0.field_1 = aVar6;
          auVar57 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar58 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          k = k + 1;
        }
        else {
          auVar23 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar15 + -2))->ptr_ofs + *psVar15 * (ulong)uVar2);
          uVar7 = vcmpps_avx512vl(auVar23,auVar57._0_16_,6);
          uVar8 = vcmpps_avx512vl(auVar23,auVar58._0_16_,1);
          if ((byte)((byte)uVar7 & (byte)uVar8) == 0xf) {
            auVar24 = *(undefined1 (*) [16])
                       (((RawBufferView *)(psVar15 + -2))->ptr_ofs + *psVar15 * uVar11);
            uVar7 = vcmpps_avx512vl(auVar24,auVar57._0_16_,6);
            uVar8 = vcmpps_avx512vl(auVar24,auVar58._0_16_,1);
            if ((byte)((byte)uVar7 & (byte)uVar8) == 0xf) goto code_r0x01c4d434;
          }
        }
      }
LAB_01c4d6e4:
      uVar12 = uVar12 + 1;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = auVar60._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = auVar59._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar47._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar48._0_16_;
    __return_storage_ptr__->end = sVar16;
  }
  return __return_storage_ptr__;
code_r0x01c4d434:
  psVar15 = psVar15 + 7;
  auVar23 = vshufps_avx(auVar23,auVar23,0xff);
  auVar24 = vshufps_avx(auVar24,auVar24,0xff);
  auVar23 = vminss_avx(auVar23,auVar24);
  if (auVar23._0_4_ < 0.0) goto LAB_01c4d6e4;
  goto LAB_01c4d3de;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }